

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-pprint.cc
# Opt level: O2

void value_type_pprint_test(void)

{
  bool bVar1;
  normal3f *v_00;
  normal3f v;
  stringstream ss;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_180,Vertex);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                          "vertex");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-pprint.cc"
                 ,0x16,"%s","ss.str() == \"vertex\"");
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  v.x = 1.0;
  v.y = 2.0;
  v.z = 3.0;
  tinyusdz::to_string_abi_cxx11_((string *)&ss,(tinyusdz *)&v,v_00);
  bVar1 = std::operator==((string *)&ss,"(1, 2, 3)");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-pprint.cc"
                 ,0x1c,"%s","s == \"(1, 2, 3)\"");
  std::__cxx11::string::~string((string *)&ss);
  return;
}

Assistant:

void value_type_pprint_test(void) {

  {
    std::stringstream ss;
    tinyusdz::Interpolation interp = tinyusdz::Interpolation::Vertex;
    ss << interp;
    TEST_CHECK(ss.str() == "vertex");
  }

  {
    value::normal3f v{1.0f, 2.0f, 3.f};
    std::string s = to_string(v);
    TEST_CHECK(s == "(1, 2, 3)");
  }
}